

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

uint __thiscall
QXmlStreamReaderPrivate::resolveCharRef(QXmlStreamReaderPrivate *this,int symbolIndex)

{
  int base;
  uint uVar1;
  long in_FS_OFFSET;
  bool bVar2;
  XmlStringRef local_40;
  QStringView local_28;
  bool local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = true;
  if (this->sym_stack[(long)symbolIndex + (long)this->tos + -1].c == 0x78) {
    symString(&local_40,this,symbolIndex,1);
    if (local_40.m_string == (QString *)0x0) {
      local_40.m_size = 0;
      local_28.m_data = (char16_t *)0x0;
    }
    else {
      local_28.m_data = ((local_40.m_string)->d).ptr;
      if (local_28.m_data == (char16_t *)0x0) {
        local_28.m_data = L"";
      }
      local_28.m_data = local_28.m_data + local_40.m_pos;
    }
    base = 0x10;
    local_28.m_size = local_40.m_size;
  }
  else {
    symString(&local_40,this,symbolIndex);
    if (local_40.m_string == (QString *)0x0) {
      local_40.m_size = 0;
      local_28.m_data = (char16_t *)0x0;
    }
    else {
      local_28.m_data = ((local_40.m_string)->d).ptr;
      if (local_28.m_data == (char16_t *)0x0) {
        local_28.m_data = L"";
      }
      local_28.m_data = local_28.m_data + local_40.m_pos;
    }
    base = 10;
    local_28.m_size = local_40.m_size;
  }
  uVar1 = QStringView::toUInt(&local_28,&local_11,base);
  bVar2 = true;
  if (((0xd < uVar1) || ((0x2600U >> (uVar1 & 0x1f) & 1) == 0)) &&
     (0x1ffd < uVar1 - 0xe000 && 0xd7df < uVar1 - 0x20)) {
    bVar2 = uVar1 - 0x10000 < 0x100000;
  }
  if ((local_11 & bVar2) == 0) {
    uVar1 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

uint QXmlStreamReaderPrivate::resolveCharRef(int symbolIndex)
{
    bool ok = true;
    uint s;
    // ### add toXShort to XmlString?
    if (sym(symbolIndex).c == 'x')
        s = symString(symbolIndex, 1).view().toUInt(&ok, 16);
    else
        s = symString(symbolIndex).view().toUInt(&ok, 10);

    ok &= (s == 0x9 || s == 0xa || s == 0xd || (s >= 0x20 && s <= 0xd7ff)
           || (s >= 0xe000 && s <= 0xfffd) || (s >= 0x10000 && s <= QChar::LastValidCodePoint));

    return ok ? s : 0;
}